

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAbstractButtonListModel.cpp
# Opt level: O2

bool __thiscall
QAbstractButtonListModel::insertRows
          (QAbstractButtonListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QMap<int,_QVariant> local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  if (((-1 < row && 0 < count) &&
      (iVar2 = (**(code **)(*(long *)this + 0x78))(this,parent), row <= iVar2)) &&
     (bVar1 = QModelIndex::isValid(parent), !bVar1)) {
    local_38.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0xffffffffffffffff;
    local_30 = 0;
    uStack_28 = 0;
    QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_38,row);
    local_38.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                    )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                      *)0x0;
    QList<QMap<int,_QVariant>_>::insert
              (&this->d->buttons,(ulong)(uint)row,(ulong)(uint)count,&local_38);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_38.d);
    QAbstractItemModel::endInsertRows();
    return true;
  }
  return false;
}

Assistant:

bool QAbstractButtonListModel::insertRows(int row, int count, const QModelIndex &parent) {
    if (count < 1 || row < 0 || row > rowCount(parent) || parent.isValid()) {
        return false;
    }

    beginInsertRows(QModelIndex(), row, row + count - 1);
    d->buttons.insert(row, count, {});
    endInsertRows();

    return true;
}